

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qimagescale_sse4.cpp
# Opt level: O3

void qt_qimageScaleAARGBA_down_xy_sse4<false>
               (QImageScaleInfo *isi,uint *dest,int dw,int dh,int dow,int sow)

{
  uint uVar1;
  uint *puVar2;
  char cVar3;
  QThreadPool *pQVar4;
  undefined8 *puVar5;
  undefined8 *puVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  uint *puVar11;
  ulong uVar12;
  uint *puVar13;
  int iVar14;
  ulong uVar15;
  int iVar16;
  uint *puVar17;
  int iVar18;
  long lVar19;
  int iVar20;
  long in_FS_OFFSET;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  int iVar27;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  int iVar28;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar29 [16];
  int iVar32;
  int iVar33;
  undefined1 in_XMM5 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  int iVar34;
  undefined1 in_XMM6 [16];
  undefined1 auVar35 [16];
  int iVar37;
  undefined1 auVar36 [16];
  undefined1 in_XMM7 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  int *yapoints;
  int *xapoints;
  int *xpoints;
  uint **ypoints;
  int **local_b8;
  uint **local_b0;
  int *local_a8;
  uint *local_a0;
  int **local_98;
  uint ***local_90;
  int **local_88;
  int *local_80;
  int *local_78;
  int *local_70;
  int *local_68;
  uint **local_60;
  int local_54;
  int local_50;
  uint local_4c;
  uint *local_48;
  undefined1 *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_b0 = &local_48;
  local_a0 = &local_4c;
  local_a8 = &local_50;
  local_80 = &local_54;
  local_60 = isi->ypoints;
  local_90 = &local_60;
  local_68 = isi->xpoints;
  local_88 = &local_68;
  local_70 = isi->xapoints;
  local_98 = &local_70;
  local_78 = isi->yapoints;
  local_b8 = &local_78;
  lVar10 = (long)isi->sw * (long)isi->sh;
  lVar19 = lVar10 + 0xffff;
  if (-1 < lVar10) {
    lVar19 = lVar10;
  }
  iVar16 = (int)((ulong)lVar19 >> 0x10);
  if (dh <= iVar16) {
    iVar16 = dh;
  }
  local_54 = sow;
  local_50 = dow;
  local_4c = dw;
  local_48 = dest;
  pQVar4 = QGuiApplicationPrivate::qtGuiThreadPool();
  if ((pQVar4 != (QThreadPool *)0x0) && (1 < iVar16)) {
    QThread::currentThread();
    cVar3 = QThreadPool::contains((QThread *)pQVar4);
    if (cVar3 == '\0') {
      local_40 = &DAT_aaaaaaaaaaaaaaaa;
      iVar9 = 0;
      QSemaphore::QSemaphore((QSemaphore *)&local_40,0);
      do {
        iVar14 = (dh - iVar9) / iVar16;
        puVar5 = (undefined8 *)operator_new(0x18);
        *(undefined1 *)(puVar5 + 1) = 1;
        *puVar5 = QFactoryLoader::keyMap;
        puVar6 = (undefined8 *)operator_new(0x20);
        *puVar6 = QRunnable::QGenericRunnable::
                  Helper<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/gui/painting/qimagescale_sse4.cpp:34:31)>
                  ::impl;
        *(int *)(puVar6 + 1) = iVar9;
        *(int *)((long)puVar6 + 0xc) = iVar14;
        puVar6[2] = &local_b8;
        puVar6[3] = &local_40;
        puVar5[2] = puVar6;
        QThreadPool::start((QRunnable *)pQVar4,(int)puVar5);
        iVar9 = iVar9 + iVar14;
        iVar16 = iVar16 + -1;
      } while (iVar16 != 0);
      QSemaphore::acquire((int)(QSemaphore *)&local_40);
      QSemaphore::~QSemaphore((QSemaphore *)&local_40);
      goto LAB_005af387;
    }
  }
  if (0 < dh) {
    uVar12 = (ulong)local_4c;
    uVar15 = 0;
    do {
      if (0 < (int)uVar12) {
        uVar1 = local_78[uVar15];
        uVar7 = uVar1 & 0xffff;
        iVar16 = (int)uVar1 >> 0x10;
        auVar21._4_4_ = iVar16;
        auVar21._0_4_ = iVar16;
        auVar21._8_4_ = iVar16;
        auVar21._12_4_ = iVar16;
        auVar22._0_8_ = CONCAT44(uVar1,uVar1) & 0xffff0000ffff;
        auVar22._8_4_ = uVar7;
        auVar22._12_4_ = uVar7;
        puVar17 = local_48 + (long)local_50 * uVar15;
        puVar2 = local_60[uVar15];
        lVar19 = 0;
        do {
          uVar1 = local_70[lVar19];
          uVar8 = uVar1 & 0xffff;
          iVar20 = (int)uVar1 >> 0x10;
          auVar29._4_4_ = iVar20;
          auVar29._0_4_ = iVar20;
          auVar29._8_4_ = iVar20;
          auVar29._12_4_ = iVar20;
          auVar23._0_8_ = CONCAT44(uVar1,uVar1) & 0xffff0000ffff;
          auVar23._8_4_ = uVar8;
          auVar23._12_4_ = uVar8;
          puVar11 = puVar2 + local_68[lVar19];
          auVar35 = pmovzxbd(in_XMM6,*puVar11);
          auVar35 = pmulld(auVar35,auVar23);
          iVar14 = 0x4000 - uVar8;
          puVar13 = puVar11;
          iVar9 = iVar14;
          while( true ) {
            iVar32 = auVar35._4_4_;
            iVar33 = auVar35._8_4_;
            iVar34 = auVar35._12_4_;
            if (iVar9 <= iVar20) break;
            auVar30 = pmovzxbd(in_XMM5,puVar13[1]);
            puVar13 = puVar13 + 1;
            in_XMM5 = pmaddwd(auVar30,auVar29);
            auVar35._0_4_ = auVar35._0_4_ + in_XMM5._0_4_;
            auVar35._4_4_ = iVar32 + in_XMM5._4_4_;
            auVar35._8_4_ = iVar33 + in_XMM5._8_4_;
            auVar35._12_4_ = iVar34 + in_XMM5._12_4_;
            iVar9 = iVar9 - iVar20;
          }
          in_XMM7 = pmovzxbd(in_XMM7,puVar13[1]);
          auVar30._4_4_ = iVar9;
          auVar30._0_4_ = iVar9;
          auVar30._8_4_ = iVar9;
          auVar30._12_4_ = iVar9;
          auVar30 = pmulld(auVar30,in_XMM7);
          auVar31._0_4_ = (uint)(auVar30._0_4_ + auVar35._0_4_) >> 4;
          auVar31._4_4_ = (uint)(auVar30._4_4_ + iVar32) >> 4;
          auVar31._8_4_ = (uint)(auVar30._8_4_ + iVar33) >> 4;
          auVar31._12_4_ = (uint)(auVar30._12_4_ + iVar34) >> 4;
          in_XMM5 = pmulld(auVar31,auVar22);
          iVar9 = 0x4000 - uVar7;
          while( true ) {
            iVar32 = in_XMM5._4_4_;
            iVar33 = in_XMM5._8_4_;
            iVar34 = in_XMM5._12_4_;
            if (iVar9 <= iVar16) break;
            puVar11 = puVar11 + local_54;
            auVar35 = pmovzxbd(auVar35,*puVar11);
            auVar35 = pmulld(auVar35,auVar23);
            iVar18 = iVar14;
            puVar13 = puVar11;
            while( true ) {
              iVar27 = auVar35._4_4_;
              iVar28 = auVar35._8_4_;
              iVar37 = auVar35._12_4_;
              if (iVar18 <= iVar20) break;
              auVar30 = pmovzxbd(in_XMM7,puVar13[1]);
              puVar13 = puVar13 + 1;
              in_XMM7 = pmaddwd(auVar30,auVar29);
              auVar35._0_4_ = auVar35._0_4_ + in_XMM7._0_4_;
              auVar35._4_4_ = iVar27 + in_XMM7._4_4_;
              auVar35._8_4_ = iVar28 + in_XMM7._8_4_;
              auVar35._12_4_ = iVar37 + in_XMM7._12_4_;
              iVar18 = iVar18 - iVar20;
            }
            in_XMM7 = pmovzxbd(in_XMM7,puVar13[1]);
            auVar38._4_4_ = iVar18;
            auVar38._0_4_ = iVar18;
            auVar38._8_4_ = iVar18;
            auVar38._12_4_ = iVar18;
            auVar30 = pmulld(auVar38,in_XMM7);
            auVar39._0_4_ = (uint)(auVar30._0_4_ + auVar35._0_4_) >> 4;
            auVar39._4_4_ = (uint)(auVar30._4_4_ + iVar27) >> 4;
            auVar39._8_4_ = (uint)(auVar30._8_4_ + iVar28) >> 4;
            auVar39._12_4_ = (uint)(auVar30._12_4_ + iVar37) >> 4;
            auVar30 = pmulld(auVar39,auVar21);
            in_XMM5._0_4_ = in_XMM5._0_4_ + auVar30._0_4_;
            in_XMM5._4_4_ = iVar32 + auVar30._4_4_;
            in_XMM5._8_4_ = iVar33 + auVar30._8_4_;
            in_XMM5._12_4_ = iVar34 + auVar30._12_4_;
            iVar9 = iVar9 - iVar16;
          }
          puVar11 = puVar11 + local_54;
          auVar35 = pmovzxbd(auVar35,*puVar11);
          auVar24 = pmulld(auVar23,auVar35);
          while( true ) {
            iVar18 = auVar24._4_4_;
            iVar28 = auVar24._12_4_;
            iVar27 = auVar24._8_4_;
            if (iVar14 <= iVar20) break;
            auVar35 = pmovzxbd(auVar35,puVar11[1]);
            puVar11 = puVar11 + 1;
            auVar35 = pmaddwd(auVar35,auVar29);
            auVar24._0_4_ = auVar24._0_4_ + auVar35._0_4_;
            auVar24._4_4_ = iVar18 + auVar35._4_4_;
            auVar24._8_4_ = iVar27 + auVar35._8_4_;
            auVar24._12_4_ = iVar28 + auVar35._12_4_;
            iVar14 = iVar14 - iVar20;
          }
          auVar35 = pmovzxbd(auVar29,puVar11[1]);
          auVar36._4_4_ = iVar14;
          auVar36._0_4_ = iVar14;
          auVar36._8_4_ = iVar14;
          auVar36._12_4_ = iVar14;
          auVar35 = pmulld(auVar36,auVar35);
          in_XMM6._0_4_ = (uint)(auVar35._0_4_ + auVar24._0_4_) >> 4;
          in_XMM6._4_4_ = (uint)(auVar35._4_4_ + iVar18) >> 4;
          in_XMM6._8_4_ = (uint)(auVar35._8_4_ + iVar27) >> 4;
          in_XMM6._12_4_ = (uint)(auVar35._12_4_ + iVar28) >> 4;
          auVar25._4_4_ = iVar9;
          auVar25._0_4_ = iVar9;
          auVar25._8_4_ = iVar9;
          auVar25._12_4_ = iVar9;
          auVar35 = pmulld(auVar25,in_XMM6);
          auVar26._0_4_ = auVar35._0_4_ + in_XMM5._0_4_;
          auVar26._4_4_ = auVar35._4_4_ + iVar32;
          auVar26._8_4_ = auVar35._8_4_ + iVar33;
          auVar26._12_4_ = auVar35._12_4_ + iVar34;
          auVar35 = pshufb(auVar26,ZEXT416(0xf0b0703));
          *puVar17 = auVar35._0_4_;
          puVar17 = puVar17 + 1;
          lVar19 = lVar19 + 1;
          uVar12 = (ulong)(int)local_4c;
        } while (lVar19 < (long)uVar12);
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 != (uint)dh);
  }
LAB_005af387:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void qt_qimageScaleAARGBA_down_xy_sse4(QImageScaleInfo *isi, unsigned int *dest,
                                       int dw, int dh, int dow, int sow)
{
    const unsigned int **ypoints = isi->ypoints;
    int *xpoints = isi->xpoints;
    int *xapoints = isi->xapoints;
    int *yapoints = isi->yapoints;

    auto scaleSection = [&] (int yStart, int yEnd) {
        for (int y = yStart; y < yEnd; ++y) {
            int Cy = yapoints[y] >> 16;
            int yap = yapoints[y] & 0xffff;
            const __m128i vCy = _mm_set1_epi32(Cy);
            const __m128i vyap = _mm_set1_epi32(yap);

            unsigned int *dptr = dest + (y * dow);
            for (int x = 0; x < dw; x++) {
                const int Cx = xapoints[x] >> 16;
                const int xap = xapoints[x] & 0xffff;
                const __m128i vCx = _mm_set1_epi32(Cx);
                const __m128i vxap = _mm_set1_epi32(xap);

                const unsigned int *sptr = ypoints[y] + xpoints[x];
                __m128i vx = qt_qimageScaleAARGBA_helper(sptr, xap, Cx, 1, vxap, vCx);
                __m128i vr = _mm_mullo_epi32(_mm_srli_epi32(vx, 4), vyap);

                int j;
                for (j = (1 << 14) - yap; j > Cy; j -= Cy) {
                    sptr += sow;
                    vx = qt_qimageScaleAARGBA_helper(sptr, xap, Cx, 1, vxap, vCx);
                    vr = _mm_add_epi32(vr, _mm_mullo_epi32(_mm_srli_epi32(vx, 4), vCy));
                }
                sptr += sow;
                vx = qt_qimageScaleAARGBA_helper(sptr, xap, Cx, 1, vxap, vCx);
                vr = _mm_add_epi32(vr, _mm_mullo_epi32(_mm_srli_epi32(vx, 4), _mm_set1_epi32(j)));

                vr = _mm_srli_epi32(vr, 24);
                vr = _mm_packus_epi32(vr, _mm_setzero_si128());
                vr = _mm_packus_epi16(vr, _mm_setzero_si128());
                *dptr = _mm_cvtsi128_si32(vr);
                if (RGB)
                    *dptr |= 0xff000000;
                dptr++;
            }
        }
    };
    multithread_pixels_function(isi, dh, scaleSection);
}